

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip.hpp
# Opt level: O0

void toml::detail::skip_until_next_table<toml::type_config>
               (location *loc,context<toml::type_config> *ctx)

{
  bool bVar1;
  char_type_conflict cVar2;
  context<toml::type_config> *in_RSI;
  location line_begin;
  spec *spec;
  location *in_stack_fffffffffffffe68;
  undefined6 in_stack_fffffffffffffe70;
  byte in_stack_fffffffffffffe76;
  byte in_stack_fffffffffffffe77;
  size_t in_stack_fffffffffffffe78;
  location *in_stack_fffffffffffffe80;
  location *in_stack_fffffffffffffe88;
  location *in_stack_fffffffffffffe90;
  context<toml::type_config> *in_stack_ffffffffffffff08;
  location *in_stack_ffffffffffffff10;
  spec *in_stack_ffffffffffffff18;
  location *in_stack_ffffffffffffff60;
  sequence *in_stack_ffffffffffffff68;
  
  context<toml::type_config>::toml_spec(in_RSI);
  do {
    bVar1 = location::eof((location *)
                          CONCAT17(in_stack_fffffffffffffe77,
                                   CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    cVar2 = location::current(in_stack_fffffffffffffe68);
    if (cVar2 == '\n') {
      location::advance(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      location::location(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      skip_whitespace<toml::type_config>(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      syntax::std_table(&in_stack_ffffffffffffff08->toml_spec_);
      sequence::scan(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      in_stack_fffffffffffffe77 = region::is_ok((region *)0x64e98e);
      region::~region((region *)
                      CONCAT17(in_stack_fffffffffffffe77,
                               CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)));
      sequence::~sequence((sequence *)
                          CONCAT17(in_stack_fffffffffffffe77,
                                   CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)));
      if ((in_stack_fffffffffffffe77 & 1) == 0) {
        syntax::array_table(in_stack_ffffffffffffff18);
        sequence::scan(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
        in_stack_fffffffffffffe76 = region::is_ok((region *)0x64ea53);
        region::~region((region *)
                        CONCAT17(in_stack_fffffffffffffe77,
                                 CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)));
        sequence::~sequence((sequence *)
                            CONCAT17(in_stack_fffffffffffffe77,
                                     CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)))
        ;
        if ((in_stack_fffffffffffffe76 & 1) == 0) {
          bVar1 = false;
        }
        else {
          location::operator=((location *)
                              CONCAT17(in_stack_fffffffffffffe77,
                                       CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)
                                      ),in_stack_fffffffffffffe68);
          bVar1 = true;
        }
      }
      else {
        location::operator=((location *)
                            CONCAT17(in_stack_fffffffffffffe77,
                                     CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)),
                            in_stack_fffffffffffffe68);
        bVar1 = true;
      }
      location::~location((location *)
                          CONCAT17(in_stack_fffffffffffffe77,
                                   CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)));
      if (bVar1) {
        return;
      }
    }
    location::advance(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  } while( true );
}

Assistant:

void skip_until_next_table(location& loc, const context<TC>& ctx)
{
    const auto& spec = ctx.toml_spec();
    while( ! loc.eof())
    {
        if(loc.current() == '\n')
        {
            loc.advance();
            const auto line_begin = loc;

            skip_whitespace(loc, ctx);
            if(syntax::std_table(spec).scan(loc).is_ok())
            {
                loc = line_begin;
                return ;
            }
            if(syntax::array_table(spec).scan(loc).is_ok())
            {
                loc = line_begin;
                return ;
            }
        }
        loc.advance();
    }
}